

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxflow.c
# Opt level: O1

void max_flow_destroy(MaxFlow *mf)

{
  if (mf->kind == MAXFLOW_ALGO_PUSH_RELABEL) {
    max_flow_destroy_push_relabel(mf);
  }
  else {
    if (mf->kind != MAXFLOW_ALGO_BRUTEFORCE) {
      __assert_fail("!\"Invalid code path\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/maxflow.c"
                    ,0x4d,"void max_flow_destroy(MaxFlow *)");
    }
    free((mf->payload).field_1.excess_flow);
    (mf->payload).field_1.flows = (flow_t *)0x0;
    (mf->payload).field_1.height = (int32_t *)0x0;
    (mf->payload).field_1.excess_flow = (flow_t *)0x0;
  }
  *(undefined8 *)((long)&mf->payload + 0x20) = 0;
  (mf->payload).field_1.list = (int32_t *)0x0;
  (mf->payload).field_1.excess_flow = (flow_t *)0x0;
  (mf->payload).field_1.curr_neigh = (int32_t *)0x0;
  (mf->payload).field_1.flows = (flow_t *)0x0;
  (mf->payload).field_1.height = (int32_t *)0x0;
  mf->nnodes = 0;
  mf->s = 0;
  mf->t = 0;
  mf->kind = MAXFLOW_ALGO_INVALID;
  return;
}

Assistant:

void max_flow_destroy(MaxFlow *mf) {

    switch (mf->kind) {
    case MAXFLOW_ALGO_BRUTEFORCE:
        max_flow_result_destroy(&mf->payload.temp_mf);
        break;
    case MAXFLOW_ALGO_PUSH_RELABEL:
        max_flow_destroy_push_relabel(mf);
        break;
    default:
        assert(!"Invalid code path");
        break;
    }

    memset(mf, 0, sizeof(*mf));
}